

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr * __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter>::
ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprPrinter> *this,
          char code,bool ignore_zero)

{
  int iVar1;
  undefined7 in_register_00000011;
  double local_68 [2];
  Expr local_58;
  ArgList local_38;
  
  local_38.field_1.values_ = (Value *)local_68;
  iVar1 = (int)CONCAT71(in_register_00000011,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    local_68[0] = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                                  *)this,code);
    if (local_68[0] != 0.0 || !ignore_zero) {
      ExprPrinter::format<double>
                (__return_storage_ptr__,*(ExprPrinter **)(this + 0x10),"{}",local_68);
      return __return_storage_ptr__;
    }
    break;
  case 0x6f:
    iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::
            ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                        *)this);
    ReadNumericExpr_abi_cxx11_(__return_storage_ptr__,this,iVar1);
    return __return_storage_ptr__;
  case 0x76:
    DoReadReference_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    if (iVar1 == 0x66) {
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>::ReadUInt
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprPrinter>
                  *)this,*(uint *)(*(long *)(this + 8) + 0x60));
      iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                        (*(BinaryReader<mp::internal::IdentityConverter> **)this);
      if (0 < iVar1) {
        do {
          ReadSymbolicExpr_abi_cxx11_(&local_58,this);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      break;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_38.types_ = 0;
    BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x139ee6,&local_38);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}